

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcfastdec.c
# Opt level: O0

int hevc_fast_dec_decode(uint8_t *bs,uint64_t bs_len,int64_t pts,void *fd_ctx,FdOutContext *out)

{
  int ret;
  HEVCContext *h;
  FDFrame frame;
  FDPacket pkt;
  FdOutContext *out_local;
  void *fd_ctx_local;
  int64_t pts_local;
  uint64_t bs_len_local;
  uint8_t *bs_local;
  
  if (fd_ctx == (void *)0x0) {
    bs_local._4_4_ = -1;
  }
  else {
    *(int64_t *)((long)fd_ctx + 0x1398) = pts;
    *(uint64_t *)((long)fd_ctx + 0x13a0) = bs_len;
    *(uint8_t **)((long)fd_ctx + 0x13a8) = bs;
    frame.opeque = (HEVCContext *)pts;
    memset(&h,0,0x50);
    fd_hevc_decode_frame_single((HEVCContext *)fd_ctx,(FDFrame *)&h,&out->got_frame);
    bs_local._4_4_ = 0;
  }
  return bs_local._4_4_;
}

Assistant:

int hevc_fast_dec_decode(uint8_t *bs, uint64_t bs_len, int64_t pts, void *fd_ctx, FdOutContext *out)
{
    FDPacket pkt;
    FDFrame frame;
    if(fd_ctx == NULL)
        return -1;

    HEVCContext *h = (HEVCContext *)fd_ctx;
    pkt.data = bs;
    pkt.size = bs_len;
    pkt.pts = pts;
    h->input_pkt = pkt;
    memset(&frame, 0, sizeof(FDFrame));
    int ret = fd_hevc_decode_frame_single(h, &frame, &out->got_frame);
    if(ret >= 0)
    {
        //output
    }
    return 0;
}